

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextoption.cpp
# Opt level: O2

void __thiscall QTextOption::setTabArray(QTextOption *this,QList<double> *tabStops)

{
  double *pdVar1;
  long lVar2;
  QTextOptionPrivate *pQVar3;
  long lVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<QTextOption::Tab> local_68;
  Tab local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->d == (QTextOptionPrivate *)0x0) {
    pQVar3 = (QTextOptionPrivate *)operator_new(0x18);
    (pQVar3->tabStops).d.d = (Data *)0x0;
    (pQVar3->tabStops).d.ptr = (Tab *)0x0;
    (pQVar3->tabStops).d.size = 0;
    this->d = pQVar3;
  }
  local_68.d = (Data *)0x0;
  local_68.ptr = (Tab *)0x0;
  local_68.size = 0;
  local_48.position = 80.0;
  local_48.type = LeftTab;
  local_48.delimiter.ucs = L'\0';
  local_48._14_2_ = 0xaaaa;
  QList<QTextOption::Tab>::reserve((QList<QTextOption::Tab> *)&local_68,(tabStops->d).size);
  pdVar1 = (tabStops->d).ptr;
  lVar2 = (tabStops->d).size;
  for (lVar4 = 0; lVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
    local_48.position = *(qreal *)((long)pdVar1 + lVar4);
    QList<QTextOption::Tab>::emplaceBack<QTextOption::Tab_const&>
              ((QList<QTextOption::Tab> *)&local_68,&local_48);
  }
  QArrayDataPointer<QTextOption::Tab>::operator=
            ((QArrayDataPointer<QTextOption::Tab> *)this->d,&local_68);
  QArrayDataPointer<QTextOption::Tab>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextOption::setTabArray(const QList<qreal> &tabStops)
{
    if (!d)
        d = new QTextOptionPrivate;
    QList<QTextOption::Tab> tabs;
    QTextOption::Tab tab;
    tabs.reserve(tabStops.size());
    for (qreal pos : tabStops) {
        tab.position = pos;
        tabs.append(tab);
    }
    d->tabStops = tabs;
}